

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Table * sqlite3FindTable(sqlite3 *db,char *zName,char *zDatabase)

{
  byte bVar1;
  int iVar2;
  HashElem *pHVar3;
  long lVar4;
  ulong uVar5;
  uchar uVar6;
  char *pKey;
  uchar uVar7;
  Hash *pH;
  Db *pDVar8;
  Hash *pH_00;
  
  if (zDatabase != (char *)0x0) {
    if (0 < (long)db->nDb) {
      pDVar8 = db->aDb;
      uVar5 = 0;
LAB_0012f066:
      lVar4 = 0;
      do {
        bVar1 = zDatabase[lVar4];
        if (bVar1 == pDVar8[uVar5].zDbSName[lVar4]) {
          if ((ulong)bVar1 == 0) goto LAB_0012f1b0;
        }
        else if (""[bVar1] != ""[(byte)pDVar8[uVar5].zDbSName[lVar4]]) goto LAB_0012f09b;
        lVar4 = lVar4 + 1;
      } while( true );
    }
LAB_0012f0a3:
    lVar4 = 0;
    do {
      bVar1 = zDatabase[lVar4];
      if (bVar1 == "main"[lVar4]) {
        if ((ulong)bVar1 == 0) goto LAB_0012f1a9;
      }
      else if (""[bVar1] != ""[(byte)"main"[lVar4]]) {
        return (Table *)0x0;
      }
      lVar4 = lVar4 + 1;
    } while( true );
  }
  pDVar8 = db->aDb;
  pH = &(pDVar8[1].pSchema)->tblHash;
  pHVar3 = findElementWithHash(pH,zName,(uint *)0x0);
  if ((Table *)pHVar3->data != (Table *)0x0) {
    return (Table *)pHVar3->data;
  }
  pH_00 = &pDVar8->pSchema->tblHash;
  pHVar3 = findElementWithHash(pH_00,zName,(uint *)0x0);
  if ((Table *)pHVar3->data != (Table *)0x0) {
    return (Table *)pHVar3->data;
  }
  iVar2 = db->nDb;
  if (2 < (long)iVar2) {
    lVar4 = 0;
    do {
      pHVar3 = findElementWithHash((Hash *)(*(long *)((long)&pDVar8[2].pSchema + lVar4) + 8),zName,
                                   (uint *)0x0);
      if ((Table *)pHVar3->data != (Table *)0x0) {
        return (Table *)pHVar3->data;
      }
      lVar4 = lVar4 + 0x20;
    } while ((long)iVar2 * 0x20 + -0x40 != lVar4);
  }
  if (zName == (char *)0x0) {
    return (Table *)0x0;
  }
  lVar4 = 0;
  do {
    if ((ulong)(byte)zName[lVar4] == 0) {
      uVar7 = ""[(byte)"sqlite_"[lVar4]];
      uVar6 = '\0';
LAB_0012f325:
      if (uVar6 != uVar7) {
        return (Table *)0x0;
      }
      break;
    }
    uVar6 = ""[(byte)zName[lVar4]];
    uVar7 = ""[(byte)"sqlite_"[lVar4]];
    if (uVar6 != uVar7) goto LAB_0012f325;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 7);
  lVar4 = 7;
  do {
    bVar1 = zName[lVar4];
    if (bVar1 == "sqlite_schema"[lVar4]) {
      if ((ulong)bVar1 == 0) goto LAB_0012f36d;
    }
    else if (""[bVar1] != ""[(byte)"sqlite_schema"[lVar4]]) {
      lVar4 = 7;
      goto LAB_0012f387;
    }
    lVar4 = lVar4 + 1;
  } while( true );
LAB_0012f09b:
  uVar5 = uVar5 + 1;
  if (uVar5 == (long)db->nDb) goto LAB_0012f0a3;
  goto LAB_0012f066;
LAB_0012f1a9:
  pDVar8 = db->aDb;
  uVar5 = 0;
LAB_0012f1b0:
  pH = &(pDVar8[uVar5 & 0xffffffff].pSchema)->tblHash;
  pHVar3 = findElementWithHash(pH,zName,(uint *)0x0);
  if ((Table *)pHVar3->data != (Table *)0x0) {
    return (Table *)pHVar3->data;
  }
  if (zName == (char *)0x0) {
    return (Table *)0x0;
  }
  lVar4 = 0;
  do {
    if ((ulong)(byte)zName[lVar4] == 0) {
      uVar7 = ""[(byte)"sqlite_"[lVar4]];
      uVar6 = '\0';
LAB_0012f21b:
      if (uVar6 != uVar7) {
        return (Table *)0x0;
      }
      break;
    }
    uVar6 = ""[(byte)zName[lVar4]];
    uVar7 = ""[(byte)"sqlite_"[lVar4]];
    if (uVar6 != uVar7) goto LAB_0012f21b;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 7);
  if ((int)uVar5 != 1) {
    lVar4 = 7;
    do {
      bVar1 = zName[lVar4];
      if (bVar1 == "sqlite_schema"[lVar4]) {
        if ((ulong)bVar1 == 0) goto LAB_0012f2c2;
      }
      else if (""[bVar1] != ""[(byte)"sqlite_schema"[lVar4]]) {
        return (Table *)0x0;
      }
      lVar4 = lVar4 + 1;
    } while( true );
  }
  lVar4 = 7;
  do {
    bVar1 = zName[lVar4];
    if (bVar1 == "sqlite_temp_schema"[lVar4]) {
      if ((ulong)bVar1 == 0) goto LAB_0012f2ff;
    }
    else if (""[bVar1] != ""[(byte)"sqlite_temp_schema"[lVar4]]) {
      lVar4 = 7;
      goto LAB_0012f29f;
    }
    lVar4 = lVar4 + 1;
  } while( true );
LAB_0012f2c2:
  pKey = "sqlite_master";
  goto LAB_0012f30e;
LAB_0012f29f:
  bVar1 = zName[lVar4];
  if (bVar1 == "sqlite_schema"[lVar4]) {
    if ((ulong)bVar1 == 0) goto LAB_0012f2ff;
  }
  else if (""[bVar1] != ""[(byte)"sqlite_schema"[lVar4]]) {
    lVar4 = 7;
    goto LAB_0012f2dc;
  }
  lVar4 = lVar4 + 1;
  goto LAB_0012f29f;
LAB_0012f2dc:
  bVar1 = zName[lVar4];
  if (bVar1 == "sqlite_master"[lVar4]) {
    if ((ulong)bVar1 == 0) goto LAB_0012f2ff;
  }
  else if (""[bVar1] != ""[(byte)"sqlite_master"[lVar4]]) {
    return (Table *)0x0;
  }
  lVar4 = lVar4 + 1;
  goto LAB_0012f2dc;
LAB_0012f2ff:
  pKey = "sqlite_temp_master";
  pH = &(pDVar8[1].pSchema)->tblHash;
  goto LAB_0012f30e;
LAB_0012f387:
  bVar1 = zName[lVar4];
  if (bVar1 == "sqlite_temp_schema"[lVar4]) {
    if ((ulong)bVar1 == 0) goto LAB_0012f3ab;
  }
  else if (""[bVar1] != ""[(byte)"sqlite_temp_schema"[lVar4]]) {
    return (Table *)0x0;
  }
  lVar4 = lVar4 + 1;
  goto LAB_0012f387;
LAB_0012f3ab:
  pKey = "sqlite_temp_master";
  goto LAB_0012f30e;
LAB_0012f36d:
  pKey = "sqlite_master";
  pH = pH_00;
LAB_0012f30e:
  pHVar3 = findElementWithHash(pH,pKey,(uint *)0x0);
  return (Table *)pHVar3->data;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3FindTable(sqlite3 *db, const char *zName, const char *zDatabase){
  Table *p = 0;
  int i;

  /* All mutexes are required for schema access.  Make sure we hold them. */
  assert( zDatabase!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  if( zDatabase ){
    for(i=0; i<db->nDb; i++){
      if( sqlite3StrICmp(zDatabase, db->aDb[i].zDbSName)==0 ) break;
    }
    if( i>=db->nDb ){
      /* No match against the official names.  But always match "main"
      ** to schema 0 as a legacy fallback. */
      if( sqlite3StrICmp(zDatabase,"main")==0 ){
        i = 0;
      }else{
        return 0;
      }
    }
    p = sqlite3HashFind(&db->aDb[i].pSchema->tblHash, zName);
    if( p==0 && sqlite3StrNICmp(zName, "sqlite_", 7)==0 ){
      if( i==1 ){
        if( sqlite3StrICmp(zName+7, &PREFERRED_TEMP_SCHEMA_TABLE[7])==0
         || sqlite3StrICmp(zName+7, &PREFERRED_SCHEMA_TABLE[7])==0
         || sqlite3StrICmp(zName+7, &LEGACY_SCHEMA_TABLE[7])==0
        ){
          p = sqlite3HashFind(&db->aDb[1].pSchema->tblHash,
                              LEGACY_TEMP_SCHEMA_TABLE);
        }
      }else{
        if( sqlite3StrICmp(zName+7, &PREFERRED_SCHEMA_TABLE[7])==0 ){
          p = sqlite3HashFind(&db->aDb[i].pSchema->tblHash,
                              LEGACY_SCHEMA_TABLE);
        }
      }
    }
  }else{
    /* Match against TEMP first */
    p = sqlite3HashFind(&db->aDb[1].pSchema->tblHash, zName);
    if( p ) return p;
    /* The main database is second */
    p = sqlite3HashFind(&db->aDb[0].pSchema->tblHash, zName);
    if( p ) return p;
    /* Attached databases are in order of attachment */
    for(i=2; i<db->nDb; i++){
      assert( sqlite3SchemaMutexHeld(db, i, 0) );
      p = sqlite3HashFind(&db->aDb[i].pSchema->tblHash, zName);
      if( p ) break;
    }
    if( p==0 && sqlite3StrNICmp(zName, "sqlite_", 7)==0 ){
      if( sqlite3StrICmp(zName+7, &PREFERRED_SCHEMA_TABLE[7])==0 ){
        p = sqlite3HashFind(&db->aDb[0].pSchema->tblHash, LEGACY_SCHEMA_TABLE);
      }else if( sqlite3StrICmp(zName+7, &PREFERRED_TEMP_SCHEMA_TABLE[7])==0 ){
        p = sqlite3HashFind(&db->aDb[1].pSchema->tblHash,
                            LEGACY_TEMP_SCHEMA_TABLE);
      }
    }
  }
  return p;
}